

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  size_t sVar1;
  ostream *poVar2;
  double precision;
  double recall;
  Mat matOutput;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [5];
  arguments_t args;
  Mat matTruth;
  long local_120;
  Mat local_d0 [96];
  Mat local_70 [96];
  
  arguments_t::arguments_t(&args,argc,argv);
  sVar1 = arguments_t::parametersSize(&args);
  if (sVar1 < 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," truth binary_image");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    arguments_t::operator[][abi_cxx11_((string *)&matOutput,&args,0);
    cv::imread((string *)&matTruth,(int)&matOutput);
    std::__cxx11::string::~string((string *)&matOutput);
    if (local_120 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Cannot load ");
      arguments_t::operator[][abi_cxx11_((string *)&matOutput,&args,0);
      poVar2 = std::operator<<(poVar2,(string *)&matOutput);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&matOutput);
    }
    else {
      arguments_t::operator[][abi_cxx11_((string *)&precision,&args,1);
      cv::imread((string *)&matOutput,(int)&precision);
      std::__cxx11::string::~string((string *)&precision);
      if (local_1c8[0]._M_allocated_capacity == 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Cannot load ");
        arguments_t::operator[][abi_cxx11_((string *)&precision,&args,1);
        poVar2 = std::operator<<(poVar2,(string *)&precision);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::string::~string((string *)&precision);
      }
      else {
        cv::Mat::Mat(local_70,&matTruth);
        cv::Mat::Mat(local_d0,&matOutput);
        score(local_70,local_d0,1,&precision,&recall);
        cv::Mat::~Mat(local_d0);
        cv::Mat::~Mat(local_70);
        poVar2 = std::ostream::_M_insert<double>(recall);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      cv::Mat::~Mat(&matOutput);
    }
    cv::Mat::~Mat(&matTruth);
  }
  arguments_t::~arguments_t(&args);
  return 0;
}

Assistant:

int main(int argc, char** argv) {

	arguments_t args(argc, argv);

	if (args.parametersSize() < 2) {
		std::cout << "usage: " << argv[0] << " truth binary_image" << std::endl;
		return 0;
	}

	cv::Mat matTruth = cv::imread(args[0], cv::IMREAD_GRAYSCALE);
	if (!matTruth.data) {
		std::cout << "Cannot load " << args[0] << std::endl;
		return 0;
	}

	cv::Mat matOutput = cv::imread(args[1], cv::IMREAD_GRAYSCALE);
	if (!matOutput.data) {
		std::cout << "Cannot load " << args[1] << std::endl;
		return 0;
	}

	double precision, recall;
	score(matTruth, matOutput, 1, precision, recall);

	std::cout << recall << std::endl;

	return 0;
}